

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWriter.cpp
# Opt level: O3

void __thiscall
MILBlob::Blob::FileWriter::FileWriter(FileWriter *this,string *filePath,bool truncateFile)

{
  uint uVar1;
  runtime_error *this_00;
  long *plVar2;
  long *plVar3;
  _Ios_Openmode _Var4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  std::fstream::fstream(this);
  _Var4 = (_Ios_Openmode)filePath;
  std::fstream::open((string *)this,_Var4);
  uVar1 = *(uint *)(&this->field_0x20 + *(long *)(*(long *)this + -0x18));
  if ((uVar1 & 5) != 0) {
    std::fstream::open((string *)this,_Var4);
    std::fstream::close();
    std::fstream::open((string *)this,_Var4);
    uVar1 = *(uint *)(&this->field_0x20 + *(long *)(*(long *)this + -0x18));
  }
  if ((uVar1 & 5) == 0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&bStack_68,"[MIL FileWriter]: Unable to open ",filePath);
  plVar2 = (long *)std::__cxx11::string::append((char *)&bStack_68);
  local_48 = (long *)*plVar2;
  plVar3 = plVar2 + 2;
  if (local_48 == plVar3) {
    local_38 = *plVar3;
    lStack_30 = plVar2[3];
    local_48 = &local_38;
  }
  else {
    local_38 = *plVar3;
  }
  local_40 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_48);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

FileWriter::FileWriter(const std::string& filePath, bool truncateFile)
{
    m_fileStream.open(filePath, GetWriterMode(truncateFile));
    if (!m_fileStream) {
        // If file does not exists, ios::in does not create one
        // Let's create a file and re-open with required flags
        m_fileStream.open(filePath, std::ofstream::binary | std::ios::out);
        m_fileStream.close();
        m_fileStream.open(filePath, GetWriterMode(truncateFile));
    }
    MILVerifyIsTrue(m_fileStream,
                    std::runtime_error,
                    "[MIL FileWriter]: Unable to open " + filePath + " file stream for writing");
}